

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

const_reference __thiscall
absl::lts_20250127::
InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
::operator[](InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
             *this,size_type i)

{
  size_type *psVar1;
  ulong uVar2;
  bool bVar3;
  undefined7 extraout_var;
  const_reference extraout_RAX;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar5;
  const_reference pVVar4;
  
  uVar2 = (this->storage_).metadata_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  if (i < uVar2 >> 1) {
    if ((uVar2 & 1) == 0) {
      pPVar5 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
               &(this->storage_).data_;
    }
    else {
      pPVar5 = (this->storage_).data_.allocated.allocated_data;
    }
    return pPVar5 + i;
  }
  InlinedVector<absl::lts_20250127::status_internal::Payload,1ul,std::allocator<absl::lts_20250127::status_internal::Payload>>
  ::operator[]();
  pVVar4 = (const_reference)(((InlineData *)i)->rep_).field_0.as_tree.rep;
  if (pVVar4 == (const_reference)0x0 || ((((InlineData *)i)->rep_).field_0.data[0] & 1U) == 0) {
    pPVar5 = (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
             (((InlineData *)i)->rep_).field_0.as_tree.rep;
    (this->storage_).metadata_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    .super_Storage<unsigned_long,_1UL,_false>.value =
         (((InlineData *)i)->rep_).field_0.as_tree.cordz_info;
    (this->storage_).data_.allocated.allocated_data = pPVar5;
  }
  else {
    LOCK();
    psVar1 = &(pVVar4->type_url)._M_string_length;
    *(int *)psVar1 = (int)*psVar1 + 2;
    UNLOCK();
    (this->storage_).data_.allocated.allocated_data = pVVar4;
    (this->storage_).metadata_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    .super_Storage<unsigned_long,_1UL,_false>.value = 1;
    bVar3 = cord_internal::InlineData::is_either_profiled((InlineData *)this,(InlineData *)i);
    pVVar4 = (const_reference)CONCAT71(extraout_var,bVar3);
    if (bVar3) {
      cord_internal::CordzInfo::MaybeTrackCordImpl
                ((InlineData *)this,(InlineData *)i,kConstructorCord);
      return extraout_RAX;
    }
  }
  return pVVar4;
}

Assistant:

bool GetIsAllocated() const { return GetSizeAndIsAllocated() & 1; }